

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endianness.cc
# Opt level: O2

bool __thiscall
Typelib::CompileEndianSwapVisitor::visit_(CompileEndianSwapVisitor *this,Compound *type)

{
  size_t sVar1;
  ulong uVar2;
  Field *this_00;
  _List_node_base *p_Var3;
  size_t sVar4;
  Type *pTVar5;
  _List_node_base *p_Var6;
  ulong uVar7;
  
  sVar1 = this->m_output_index;
  p_Var3 = (_List_node_base *)Compound::getFields_abi_cxx11_(type);
  p_Var6 = p_Var3;
  while (p_Var6 = (((_List_base<Typelib::Field,_std::allocator<Typelib::Field>_> *)&p_Var6->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next, p_Var6 != p_Var3) {
    this_00 = (Field *)(p_Var6 + 1);
    sVar4 = Field::getOffset(this_00);
    uVar7 = sVar4 + sVar1;
    uVar2 = this->m_output_index;
    if (uVar2 <= uVar7) {
      if (uVar2 < uVar7) {
        skip(this,(int)uVar7 - (int)uVar2);
      }
      this->m_output_index = uVar7;
      pTVar5 = Field::getType(this_00);
      TypeVisitor::dispatch(&this->super_TypeVisitor,pTVar5);
      pTVar5 = Field::getType(this_00);
      sVar4 = Type::getSize(pTVar5);
      this->m_output_index = sVar4 + uVar7;
    }
  }
  return true;
}

Assistant:

bool CompileEndianSwapVisitor::visit_ (Compound const& type)
    {
        size_t base_index = m_output_index;

        typedef Compound::FieldList Fields;
        Fields const& fields(type.getFields());
        Fields::const_iterator const end = fields.end();

        for (Fields::const_iterator it = fields.begin(); it != end; ++it)
        {
            size_t new_index = base_index + it->getOffset();
            if (new_index < m_output_index)
                continue;
            else if (new_index > m_output_index)
                skip(new_index - m_output_index);

            m_output_index = new_index;
            dispatch(it->getType());
            m_output_index = new_index + it->getType().getSize();
        }
        return true;
    }